

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

void doctest::detail::filldata<ApprovalTests::Windows::KDiff3Reporter_*>::fill
               (ostream *stream,KDiff3Reporter *in)

{
  ostream *in_RSI;
  void *in_stack_ffffffffffffffe8;
  
  filldata<const_void_*>::fill(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void fill(std::ostream* stream, const T* in) {
DOCTEST_MSVC_SUPPRESS_WARNING_POP
DOCTEST_CLANG_SUPPRESS_WARNING_WITH_PUSH("-Wmicrosoft-cast")
            filldata<const void*>::fill(stream,
#if DOCTEST_GCC == 0 || DOCTEST_GCC >= DOCTEST_COMPILER(4, 9, 0)
                reinterpret_cast<const void*>(in)
#else
                *reinterpret_cast<const void* const*>(&in)
#endif
            );
DOCTEST_CLANG_SUPPRESS_WARNING_POP
        }